

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<11,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int row;
  long lVar1;
  float fVar2;
  Mat2x3 m;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> res_2;
  Matrix<float,_3,_2> local_98;
  float local_80 [4];
  float local_70 [4];
  float local_60 [4];
  int aiStack_50 [6];
  float local_38 [6];
  float local_20 [3];
  float afStack_14 [3];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar1 = 0;
    do {
      fVar2 = 1.0;
      if (lVar1 != 0) {
        fVar2 = 0.0;
      }
      local_98.m_data.m_data[0].m_data[lVar1] = fVar2;
      fVar2 = 1.0;
      if (lVar1 != 1) {
        fVar2 = 0.0;
      }
      local_80[lVar1 + -3] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_98.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_98.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    lVar1 = 0;
    do {
      fVar2 = (float)(&DAT_00ae3c74)[lVar1 * 2];
      local_98.m_data.m_data[0].m_data[lVar1] = (float)(&s_constInMat2x3)[lVar1 * 2];
      local_80[lVar1 + -3] = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  increment<float,3,2>(&local_98);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar1 = 0;
  do {
    local_70[lVar1] = local_38[lVar1 + 6] + local_38[lVar1 + 9];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  increment<float,3,2>(&local_98);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar1 = 0;
  do {
    local_80[lVar1] = local_38[lVar1] + local_38[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar1 = 0;
  do {
    local_70[lVar1 + 4] = local_70[lVar1] + local_80[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_50[2] = 0;
  aiStack_50[3] = 1;
  aiStack_50[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_50[lVar1]] = local_70[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}